

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sspm.cpp
# Opt level: O0

void __thiscall pg::SSPMSolver::run(SSPMSolver *this,int n_bits,int depth,int player)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  bool bVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  int *piVar10;
  long lVar11;
  ostream *poVar12;
  char *pcVar13;
  _label_vertex _Var14;
  int local_a4;
  int v_2;
  _label_vertex local_90;
  Game *local_80;
  int local_78;
  _label_vertex local_70;
  int local_60;
  int local_5c;
  int v_1;
  int v;
  int s_2;
  int from_1;
  int *curedge_1;
  int local_40;
  int n_1;
  int s_1;
  int from;
  int *curedge;
  int local_28;
  int s;
  int n;
  int player_local;
  int depth_local;
  int n_bits_local;
  SSPMSolver *this_local;
  
  this->l = n_bits;
  this->h = depth;
  iVar7 = this->l;
  s = player;
  n = depth;
  player_local = n_bits;
  _depth_local = this;
  lVar8 = Solver::nodecount(&this->super_Solver);
  bitset::resize(&this->pm_b,iVar7 * lVar8);
  iVar7 = this->l;
  lVar8 = Solver::nodecount(&this->super_Solver);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = iVar7 * lVar8;
  uVar9 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar9 = 0xffffffffffffffff;
  }
  piVar10 = (int *)operator_new__(uVar9);
  this->pm_d = piVar10;
  bitset::resize(&this->tmp_b,(long)this->l);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)this->l;
  uVar9 = SUB168(auVar2 * ZEXT816(4),0);
  if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
    uVar9 = 0xffffffffffffffff;
  }
  piVar10 = (int *)operator_new__(uVar9);
  this->tmp_d = piVar10;
  bitset::resize(&this->best_b,(long)this->l);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)this->l;
  uVar9 = SUB168(auVar3 * ZEXT816(4),0);
  if (SUB168(auVar3 * ZEXT816(4),8) != 0) {
    uVar9 = 0xffffffffffffffff;
  }
  piVar10 = (int *)operator_new__(uVar9);
  this->best_d = piVar10;
  bitset::resize(&this->test_b,(long)this->l);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (long)this->l;
  uVar9 = SUB168(auVar4 * ZEXT816(4),0);
  if (SUB168(auVar4 * ZEXT816(4),8) != 0) {
    uVar9 = 0xffffffffffffffff;
  }
  piVar10 = (int *)operator_new__(uVar9);
  this->test_d = piVar10;
  piVar10 = this->pm_d;
  iVar7 = this->l;
  lVar8 = Solver::nodecount(&this->super_Solver);
  memset(piVar10,0,iVar7 * lVar8 * 4);
  lVar8 = Solver::nodecount(&this->super_Solver);
  local_28 = (int)lVar8;
  while (local_28 = local_28 + -1, -1 < local_28) {
    bVar5 = bitset::operator[]((this->super_Solver).disabled,(long)local_28);
    if (!bVar5) {
      this->lift_attempt = this->lift_attempt + 1;
      bVar5 = lift(this,local_28,-1,(int *)((long)&curedge + 4),s);
      if (bVar5) {
        this->lift_count = this->lift_count + 1;
        for (_s_1 = Solver::ins(&this->super_Solver,local_28); *_s_1 != -1; _s_1 = _s_1 + 1) {
          n_1 = *_s_1;
          bVar5 = bitset::operator[]((this->super_Solver).disabled,(long)n_1);
          if (!bVar5) {
            this->lift_attempt = this->lift_attempt + 1;
            bVar5 = lift(this,n_1,local_28,&local_40,s);
            if (bVar5) {
              this->lift_count = this->lift_count + 1;
              todo_push(this,n_1);
            }
          }
        }
      }
    }
  }
  while (this_local = (SSPMSolver *)&this->Q, (this->Q).pointer != 0) {
    curedge_1._4_4_ = todo_pop(this);
    for (_s_2 = Solver::ins(&this->super_Solver,curedge_1._4_4_); *_s_2 != -1; _s_2 = _s_2 + 1) {
      v = *_s_2;
      bVar5 = bitset::operator[]((this->super_Solver).disabled,(long)v);
      if (!bVar5) {
        this->lift_attempt = this->lift_attempt + 1;
        bVar5 = lift(this,v,curedge_1._4_4_,&v_1,s);
        if (bVar5) {
          this->lift_count = this->lift_count + 1;
          todo_push(this,v);
        }
      }
    }
  }
  for (local_5c = 0; lVar8 = (long)local_5c, lVar11 = Solver::nodecount(&this->super_Solver),
      lVar8 < lVar11; local_5c = local_5c + 1) {
    bVar5 = bitset::operator[]((this->super_Solver).disabled,(long)local_5c);
    if (((!bVar5) && (this->pm_d[this->l * local_5c] != -1)) &&
       (iVar6 = Solver::owner(&this->super_Solver,local_5c), iVar7 = local_5c, iVar6 != s)) {
      piVar10 = Game::getStrategy((this->super_Solver).game);
      bVar5 = lift(this,iVar7,-1,piVar10 + local_5c,s);
      if (bVar5) {
        poVar12 = std::operator<<((this->super_Solver).logger,"error: ");
        poVar12 = (ostream *)std::ostream::operator<<(poVar12,local_5c);
        poVar12 = std::operator<<(poVar12," is not progressive!");
        std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
      }
    }
  }
  if ((this->super_Solver).trace != 0) {
    for (local_60 = 0; lVar8 = (long)local_60, lVar11 = Solver::nodecount(&this->super_Solver),
        lVar8 < lVar11; local_60 = local_60 + 1) {
      bVar5 = bitset::operator[]((this->super_Solver).disabled,(long)local_60);
      if (!bVar5) {
        poVar12 = std::operator<<((this->super_Solver).logger,"\x1b[1m");
        _Var14 = Solver::label_vertex(&this->super_Solver,local_60);
        local_80 = _Var14.g;
        local_78 = _Var14.v;
        local_70.g = local_80;
        local_70.v = local_78;
        poVar12 = operator<<(poVar12,&local_70);
        iVar7 = Solver::owner(&this->super_Solver,local_60);
        pcVar13 = " (even)";
        if (iVar7 != 0) {
          pcVar13 = " (odd)";
        }
        poVar12 = std::operator<<(poVar12,pcVar13);
        std::operator<<(poVar12,"\x1b[m:");
        stream_pm(this,(this->super_Solver).logger,local_60);
        if ((this->pm_d[this->l * local_60] != -1) &&
           (iVar7 = Solver::owner(&this->super_Solver,local_60), iVar7 != s)) {
          poVar12 = std::operator<<((this->super_Solver).logger," => ");
          iVar7 = Game::getStrategy((this->super_Solver).game,local_60);
          _Var14 = Solver::label_vertex(&this->super_Solver,iVar7);
          local_90.g = _Var14.g;
          local_90.v = _Var14.v;
          operator<<(poVar12,&local_90);
        }
        std::ostream::operator<<((this->super_Solver).logger,std::endl<char,std::char_traits<char>>)
        ;
      }
    }
  }
  for (local_a4 = 0; lVar8 = Solver::nodecount(&this->super_Solver), local_a4 < lVar8;
      local_a4 = local_a4 + 1) {
    bVar5 = bitset::operator[]((this->super_Solver).disabled,(long)local_a4);
    if ((!bVar5) && (this->pm_d[this->l * local_a4] != -1)) {
      iVar6 = 1 - s;
      iVar7 = Game::getStrategy((this->super_Solver).game,local_a4);
      Solver::solve(&this->super_Solver,local_a4,iVar6,iVar7);
    }
  }
  Solver::flush(&this->super_Solver);
  if (this->pm_d != (int *)0x0) {
    operator_delete__(this->pm_d);
  }
  if (this->tmp_d != (int *)0x0) {
    operator_delete__(this->tmp_d);
  }
  if (this->best_d != (int *)0x0) {
    operator_delete__(this->best_d);
  }
  if (this->test_d != (int *)0x0) {
    operator_delete__(this->test_d);
  }
  return;
}

Assistant:

void
SSPMSolver::run(int n_bits, int depth, int player)
{
    l = n_bits;
    h = depth;

    pm_b.resize(l*nodecount());
    pm_d = new int[l*nodecount()];

    tmp_b.resize(l);
    tmp_d = new int[l];

    best_b.resize(l);
    best_d = new int[l];

    test_b.resize(l);
    test_d = new int[l];

    // initialize progress measures
    // pm_b.reset(); // standard set to 0 already
    memset(pm_d, 0, sizeof(int[l*nodecount()])); // every bit in the top ( = min )

    // lift_counters = new uint64_t[nodecount()];
    // memset(lift_counters, 0, sizeof(uint64_t[nodecount()]));

    for (int n=nodecount()-1; n>=0; n--) {
        if (disabled[n]) continue;
        lift_attempt++;
        int s;
        if (lift(n, -1, s, player)) {
            lift_count++;
            // lift_counters[n]++;
            for (auto curedge = ins(n); *curedge != -1; curedge++) {
                int from = *curedge;
                if (disabled[from]) continue;
                lift_attempt++;
                int s;
                if (lift(from, n, s, player)) {
                    lift_count++;
                    // lift_counters[from]++;
                    todo_push(from);
                }
            }
        }
    }

    while (!Q.empty()) {
        int n = todo_pop();
        for (auto curedge = ins(n); *curedge != -1; curedge++) {
            int from = *curedge;
            if (disabled[from]) continue;
            lift_attempt++;
            int s;
            if (lift(from, n, s, player)) {
                lift_count++;
                // lift_counters[from]++;
                todo_push(from);
            }
        }
    }

    /**
     * Derive strategies.
     */

    for (int v=0; v<nodecount(); v++) {
        if (disabled[v]) continue;
        if (pm_d[l*v] != -1) {
            if (owner(v) != player) {
                // TODO: don't rely on the strategy array in the Game class
                if (lift(v, -1, game.getStrategy()[v], player)) logger << "error: " << v << " is not progressive!" << std::endl;
            }
        }
    }

    if (trace) {
        for (int v=0; v<nodecount(); v++) {
            if (disabled[v]) continue;

            logger << "\033[1m" << label_vertex(v) << (owner(v)?" (odd)":" (even)") << "\033[m:";
            stream_pm(logger, v);

            if (pm_d[l*v] != -1) {
                if (owner(v) != player) {
                    logger << " => " << label_vertex(game.getStrategy(v));
                }
            }

            logger << std::endl;
        }
    }

    /**
     * Mark solved.
     */

    for (int v=0; v<nodecount(); v++) {
        if (disabled[v]) continue;
        if (pm_d[l*v] != -1) Solver::solve(v, 1-player, game.getStrategy(v));
    }

    Solver::flush();

    /*
    {
        uint64_t hi_c = 0;
        int hi_n = -1;
        for (int i=0; i<nodecount(); i++) {
            if (hi_c < lift_counters[i]) {
                hi_c = lift_counters[i];
                hi_n = i;
            }
        }
        logger << "highest counter: " << hi_c << " lifts for vertex " << label_vertex(hi_n) << std::endl;
    }
    */

    delete[] pm_d;
    delete[] tmp_d;
    delete[] best_d;
    delete[] test_d;
}